

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

bool __thiscall Catch::AssertionHandler::allowThrows(AssertionHandler *this)

{
  undefined1 uVar1;
  undefined **ppuVar2;
  undefined8 *puVar3;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar2 = &PTR__Context_001b7d00;
    *IMutableContext::currentContext = &PTR__Context_001b7d00;
    IMutableContext::currentContext[1] = &PTR__Context_001b7d50;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar2 = (undefined **)*IMutableContext::currentContext;
  }
  puVar3 = (undefined8 *)(*(code *)ppuVar2[4])();
  uVar1 = (**(code **)(*(long *)*puVar3 + 0x10))();
  return (bool)uVar1;
}

Assistant:

auto AssertionHandler::allowThrows() const -> bool {
        return getCurrentContext().getConfig()->allowThrows();
    }